

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::Catalog::CreateIndex(Catalog *this,CatalogTransaction transaction,CreateIndexInfo *info)

{
  SchemaCatalogEntry *this_00;
  CatalogEntry *pCVar1;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  optional_ptr<duckdb::CatalogEntry,_true> local_18;
  undefined4 extraout_var;
  
  this_00 = GetSchema(this,transaction,&(info->super_CreateInfo).schema);
  local_18 = SchemaCatalogEntry::GetEntry(this_00,transaction,TABLE_ENTRY,&info->table);
  pCVar1 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&local_18);
  oVar2.ptr._0_4_ =
       (*(this_00->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x12])
                 (this_00,info,pCVar1);
  oVar2.ptr._4_4_ = extraout_var;
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreateIndex(CatalogTransaction transaction, CreateIndexInfo &info) {
	auto &schema = GetSchema(transaction, info.schema);
	auto &table = schema.GetEntry(transaction, CatalogType::TABLE_ENTRY, info.table)->Cast<TableCatalogEntry>();
	return schema.CreateIndex(transaction, info, table);
}